

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O2

void attoAppInit(AAppProctable *proctable)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  TriVertex *pTVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar20;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 in_XMM1_Db;
  undefined4 uVar21;
  undefined4 in_XMM1_Dd;
  float fVar22;
  float fVar23;
  AVec3f AVar24;
  ALCGRand local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  aGLInit();
  local_a0.state_ = 0x4000;
  g.vertices_count = 0x18000;
  g.vertices = (TriVertex *)malloc(0x480000);
  for (lVar16 = 0; pTVar13 = g.vertices, uVar21 = 0, lVar16 != 0x480000; lVar16 = lVar16 + 0x120) {
    AVar24 = randomVector(&local_a0,1.0);
    local_88 = AVar24.z;
    local_98 = AVar24._0_8_;
    *(undefined8 *)((long)&pTVar13[2].tricenter.x + lVar16) = local_98;
    *(float *)((long)&pTVar13[2].tricenter.z + lVar16) = local_88;
    uVar6 = *(undefined8 *)((long)&pTVar13[2].tricenter.x + lVar16);
    *(undefined8 *)((long)&pTVar13[1].tricenter.x + lVar16) = uVar6;
    uVar5 = *(undefined4 *)((long)&pTVar13[2].tricenter.z + lVar16);
    *(undefined4 *)((long)&pTVar13[1].tricenter.z + lVar16) = uVar5;
    *(undefined8 *)((long)&(pTVar13->tricenter).x + lVar16) = uVar6;
    *(undefined4 *)((long)&(pTVar13->tricenter).z + lVar16) = uVar5;
    uStack_90 = extraout_XMM0_Qb;
    uStack_84 = in_XMM1_Db;
    uStack_80 = uVar21;
    uStack_7c = in_XMM1_Dd;
    AVar24 = randomVector(&local_a0,0.1);
    local_68 = AVar24.z;
    uStack_60 = 0;
    local_48 = AVar24.x + (float)local_98;
    fStack_44 = AVar24.y + local_98._4_4_;
    fStack_40 = (float)extraout_XMM0_Qb_00 + (float)uStack_90;
    fStack_3c = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) + uStack_90._4_4_;
    pfVar2 = (float *)((long)&(pTVar13->pos).x + lVar16);
    *pfVar2 = local_48;
    pfVar2[1] = fStack_44;
    uStack_64 = in_XMM1_Db;
    uStack_5c = in_XMM1_Dd;
    AVar24 = randomVector(&local_a0,0.1);
    local_78 = AVar24.x + (float)local_98;
    fStack_74 = AVar24.y + local_98._4_4_;
    fStack_70 = (float)extraout_XMM0_Qb_01 + (float)uStack_90;
    fStack_6c = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20) + uStack_90._4_4_;
    local_58 = AVar24.z + local_88;
    uStack_50 = 0;
    pfVar2 = (float *)((long)&pTVar13[1].pos.x + lVar16);
    *pfVar2 = local_78;
    pfVar2[1] = fStack_74;
    *(float *)((long)&pTVar13[1].pos.z + lVar16) = local_58;
    uStack_54 = in_XMM1_Db;
    uStack_4c = in_XMM1_Dd;
    AVar24 = randomVector(&local_a0,0.1);
    fVar22 = (float)local_98 + AVar24.x;
    fVar23 = local_98._4_4_ + AVar24.y;
    *(ulong *)((long)&pTVar13[2].pos.x + lVar16) = CONCAT44(fVar23,fVar22);
    fVar20 = AVar24.z + local_88;
    *(float *)((long)&(pTVar13->pos).z + lVar16) = local_68 + local_88;
    *(float *)((long)&pTVar13[2].pos.z + lVar16) = fVar20;
    fVar22 = fVar22 - local_78;
    fVar23 = fVar23 - fStack_74;
    fVar17 = (local_68 + local_88) - local_58;
    fVar20 = fVar20 - local_58;
    AVar24.z = fVar23 * (local_48 - local_78) - (fStack_44 - fStack_74) * fVar22;
    AVar24.y = fVar17 * fVar22 - fVar20 * (local_48 - local_78);
    AVar24.x = fVar20 * (fStack_44 - fStack_74) - fVar17 * fVar23;
    AVar24 = aVec3fNormalize(AVar24);
    *(long *)((long)&pTVar13[2].normal.x + lVar16) = AVar24._0_8_;
    *(float *)((long)&pTVar13[2].normal.z + lVar16) = AVar24.z;
    uVar6 = *(undefined8 *)((long)&pTVar13[2].normal.x + lVar16);
    *(undefined8 *)((long)&pTVar13[1].normal.x + lVar16) = uVar6;
    uVar21 = *(undefined4 *)((long)&pTVar13[2].normal.z + lVar16);
    *(undefined4 *)((long)&pTVar13[1].normal.z + lVar16) = uVar21;
    *(undefined8 *)((long)&(pTVar13->normal).x + lVar16) = uVar6;
    *(undefined4 *)((long)&(pTVar13->normal).z + lVar16) = uVar21;
    lVar14 = local_a0.state_ * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    lVar15 = lVar14 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    auVar18._0_4_ = (undefined4)((ulong)lVar14 >> 0x18);
    auVar18._8_4_ = (undefined4)((ulong)lVar15 >> 0x18);
    auVar18._4_4_ = auVar18._8_4_;
    auVar18[0xc] = (char)((ulong)lVar15 >> 0x38);
    auVar18._13_3_ = 0;
    auVar18 = auVar18 & _DAT_00107040;
    auVar19._0_4_ = (float)auVar18._0_4_;
    auVar19._4_4_ = (float)auVar18._4_4_;
    auVar19._8_4_ = (float)auVar18._8_4_;
    auVar19._12_4_ = (float)auVar18._12_4_;
    auVar18 = divps(auVar19,_DAT_00107050);
    local_a0.state_ = lVar15 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    *(long *)((long)&pTVar13[2].color.x + lVar16) = auVar18._0_8_;
    *(float *)((long)&pTVar13[2].color.z + lVar16) =
         (float)((uint)(local_a0.state_ >> 0x18) & 0xffffff) / 16777215.0;
    uVar6 = *(undefined8 *)((long)&pTVar13[2].color.x + lVar16);
    *(undefined8 *)((long)&pTVar13[1].color.x + lVar16) = uVar6;
    uVar21 = *(undefined4 *)((long)&pTVar13[2].color.z + lVar16);
    *(undefined4 *)((long)&pTVar13[1].color.z + lVar16) = uVar21;
    *(undefined8 *)((long)&(pTVar13->color).x + lVar16) = uVar6;
    *(undefined4 *)((long)&(pTVar13->color).z + lVar16) = uVar21;
    puVar3 = (undefined8 *)((long)&(pTVar13->pos).x + lVar16);
    uVar6 = puVar3[1];
    puVar1 = (undefined8 *)((long)&(pTVar13->tricenter).y + lVar16);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar13[2].pos.x + lVar16);
    uVar9 = *puVar1;
    uVar10 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar13[2].tricenter.y + lVar16);
    uVar11 = *puVar1;
    uVar12 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar13[3].pos.x + lVar16);
    *puVar1 = *puVar3;
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)&pTVar13[3].tricenter.y + lVar16);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)&(pTVar13->normal).z + lVar16);
    uVar6 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar13[3].normal.z + lVar16);
    *puVar3 = *puVar1;
    puVar3[1] = uVar6;
    puVar1 = (undefined8 *)((long)&pTVar13[4].pos.x + lVar16);
    *puVar1 = uVar9;
    puVar1[1] = uVar10;
    puVar1 = (undefined8 *)((long)&pTVar13[4].tricenter.y + lVar16);
    *puVar1 = uVar11;
    puVar1[1] = uVar12;
    puVar1 = (undefined8 *)((long)&pTVar13[2].normal.z + lVar16);
    uVar6 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar13[4].normal.z + lVar16);
    *puVar3 = *puVar1;
    puVar3[1] = uVar6;
    puVar1 = (undefined8 *)((long)&pTVar13[1].tricenter.y + lVar16);
    uVar6 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar13[5].tricenter.y + lVar16);
    *puVar3 = *puVar1;
    puVar3[1] = uVar6;
    puVar1 = (undefined8 *)((long)&pTVar13[1].normal.z + lVar16);
    uVar6 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar13[5].normal.z + lVar16);
    *puVar3 = *puVar1;
    puVar3[1] = uVar6;
    puVar1 = (undefined8 *)((long)&pTVar13[1].pos.x + lVar16);
    uVar6 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar13[5].pos.x + lVar16);
    *puVar3 = *puVar1;
    puVar3[1] = uVar6;
    in_XMM1_Db = 0x80000000;
    in_XMM1_Dd = 0x80000000;
    uVar4 = *(uint *)((long)&(pTVar13->normal).z + lVar16);
    *(ulong *)((long)&pTVar13[5].normal.x + lVar16) =
         *(ulong *)((long)&(pTVar13->normal).x + lVar16) ^ 0x8000000080000000;
    *(uint *)((long)&pTVar13[5].normal.z + lVar16) = uVar4 ^ 0x80000000;
    uVar6 = *(undefined8 *)((long)&pTVar13[5].normal.x + lVar16);
    *(undefined8 *)((long)&pTVar13[4].normal.x + lVar16) = uVar6;
    uVar21 = *(undefined4 *)((long)&pTVar13[5].normal.z + lVar16);
    *(undefined4 *)((long)&pTVar13[4].normal.z + lVar16) = uVar21;
    *(undefined8 *)((long)&pTVar13[3].normal.x + lVar16) = uVar6;
    *(undefined4 *)((long)&pTVar13[3].normal.z + lVar16) = uVar21;
  }
  g.draw.program =
       aGLProgramCreateSimple
                 ("uniform mat4 um4_vp, um4_model;\nuniform vec3 uv3_lightpos;\nattribute vec3 av3_pos, av3_normal, av3_color, av3_tricenter;\nvarying vec3 vv3_color;\nvoid main() {\n  vec4 pos = um4_model * vec4(av3_pos, 1.);\n  vec3 normal = (um4_model * vec4(av3_normal, 0.)).xyz;\n  vec3 ldir = uv3_lightpos - pos.xyz;  vv3_color = av3_color * max(0., dot(normalize(ldir), normal)) / dot(ldir,ldir);\n  gl_Position = um4_vp * pos;\n}"
                  ,
                  "varying vec3 vv3_color;\nvoid main() {\n  gl_FragColor = vec4(vv3_color, 1.);\n}"
                 );
  if (g.draw.program < 1) {
    aAppDebugPrintf("shader error: %s",a_gl_error);
  }
  g.attr[0].name = "av3_pos";
  g.attr[0].buffer = (AGLBuffer *)0x0;
  g.attr[0].size = 3;
  g.attr[0].type = 0x1406;
  g.attr[0].normalized = '\0';
  g.attr[0].stride = 0x30;
  g.attr[0].ptr = g.vertices;
  g.attr[2].name = "av3_normal";
  g.attr[2].buffer = (AGLBuffer *)0x0;
  g.attr[2].size = 3;
  g.attr[2].type = 0x1406;
  g.attr[2].normalized = '\0';
  g.attr[2].ptr = &(g.vertices)->normal;
  g.attr[1].name = "av3_tricenter";
  g.attr[1].buffer = (AGLBuffer *)0x0;
  g.attr[1].size = 3;
  g.attr[1].type = 0x1406;
  g.attr[1].normalized = '\0';
  g.attr[1].ptr = &(g.vertices)->tricenter;
  g.attr[3].name = "av3_color";
  g.attr[3].buffer = (AGLBuffer *)0x0;
  g.attr[3].size = 3;
  g.attr[3].type = 0x1406;
  g.attr[3].normalized = '\0';
  g.attr[3].ptr = &(g.vertices)->color;
  g.pun[0].name = "um4_vp";
  g.pun[0].type = AGLAT_Mat4;
  g.pun[0].count = 1;
  g.pun[1].name = "um4_model";
  g.pun[1].type = AGLAT_Mat4;
  g.pun[1].count = 1;
  g.pun[2].name = "uv3_lightpos";
  g.pun[2].type = AGLAT_Vec3;
  g.pun[2].count = 1;
  g.draw.attribs.n = 4;
  g.draw.primitive.count = g.vertices_count;
  g.draw.primitive.first = 0;
  g.draw.primitive.index.data.ptr = (GLvoid *)0x0;
  g.draw.primitive.index.buffer = (AGLBuffer *)0x0;
  g.draw.primitive.cull_mode = AGLCM_Front;
  g.draw.primitive.front_face = AGLFF_CounterClockwise;
  g.draw.attribs.p = g.attr;
  g.attr[1].stride = g.attr[0].stride;
  g.attr[2].stride = g.attr[0].stride;
  g.attr[3].stride = g.attr[0].stride;
  g.draw.primitive.mode = g.draw.attribs.n;
  aGLAttributeLocate(g.draw.program,g.attr,4);
  g.draw.uniforms.p = g.pun;
  g.draw.uniforms.n = 3;
  aGLUniformLocate(g.draw.program,g.pun,3);
  g.merge.blend.enable = 0;
  g.merge.depth.mode = AGLDM_TestAndWrite;
  g.merge.depth.func = AGLDF_Less;
  proctable->resize = resize;
  proctable->paint = paint;
  proctable->key = keyPress;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	aGLInit();
	init();

	proctable->resize = resize;
	proctable->paint = paint;
	proctable->key = keyPress;
}